

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O2

void boost::unit_test::utils::print_escaped_cdata(ostream *where_to,const_string *value)

{
  int iVar1;
  size_type sVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ulong uVar4;
  const_string local_68;
  basic_cstring<const_char> local_50;
  basic_cstring<const_char> local_40;
  basic_cstring<const_char> local_30;
  
  if ((print_escaped_cdata(std::ostream&,boost::unit_test::basic_cstring<char_const>)::cdata_end ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&print_escaped_cdata(std::ostream&,boost::unit_test::basic_cstring<char_const>)
                                   ::cdata_end), iVar1 != 0)) {
    basic_cstring<const_char>::basic_cstring(&print_escaped_cdata::cdata_end,"]]>");
    __cxa_guard_release(&print_escaped_cdata(std::ostream&,boost::unit_test::basic_cstring<char_const>)
                         ::cdata_end);
  }
  local_68 = print_escaped_cdata::cdata_end;
  sVar2 = basic_cstring<const_char>::find(value,&local_68);
  if (sVar2 != 0xffffffffffffffff) {
    local_30.m_begin = value->m_begin;
    local_30.m_end = local_30.m_begin + sVar2 + 2;
    if ((ulong)((long)value->m_end - (long)local_30.m_begin) < sVar2 + 2) {
      local_30.m_end = value->m_end;
    }
    pbVar3 = unit_test::operator<<(where_to,&local_30);
    pbVar3 = unit_test::operator<<(pbVar3,&print_escaped_cdata::cdata_end);
    local_40.m_begin = "<![CDATA[";
    local_40.m_end = "";
    where_to = unit_test::operator<<(pbVar3,&local_40);
    local_50.m_begin = value->m_begin;
    uVar4 = (long)value->m_end - (long)local_50.m_begin;
    local_50.m_end = local_50.m_begin + -1;
    if (uVar4 != 0xffffffffffffffff) {
      local_50.m_end = value->m_end;
    }
    local_50.m_begin = local_50.m_begin + sVar2 + 2;
    if (uVar4 < sVar2 + 2) {
      local_50.m_begin = "";
      local_50.m_end = "";
    }
    value = &local_50;
  }
  unit_test::operator<<(where_to,value);
  return;
}

Assistant:

inline void
print_escaped_cdata( std::ostream& where_to, const_string value )
{
    static const_string cdata_end( "]]>" );

    const_string::size_type pos = value.find( cdata_end );
    if( pos == const_string::npos )
        where_to << value;
    else {
        where_to << value.substr( 0, pos+2 ) << cdata_end
                 << BOOST_TEST_L( "<![CDATA[" ) << value.substr( pos+2 );
    }
}